

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O0

void jpeg_CreateDecompress(j_decompress_ptr cinfo,int version,size_t structsize)

{
  long lVar1;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  void *client_data;
  jpeg_error_mgr *err;
  int i;
  j_decompress_ptr cinfo_00;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI[1] = 0;
  if (in_ESI != 0x3e) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xc;
    *(undefined4 *)(*in_RDI + 0x2c) = 0x3e;
    *(int *)(*in_RDI + 0x30) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_RDX != 0x278) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x15;
    *(undefined4 *)(*in_RDI + 0x2c) = 0x278;
    *(int *)(*in_RDI + 0x30) = (int)in_RDX;
    (**(code **)*in_RDI)(in_RDI);
  }
  lVar1 = *in_RDI;
  cinfo_00 = (j_decompress_ptr)in_RDI[3];
  memset(in_RDI,0,0x278);
  *in_RDI = lVar1;
  in_RDI[3] = (long)cinfo_00;
  *(undefined4 *)(in_RDI + 4) = 1;
  jinit_memory_mgr((j_common_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  in_RDI[2] = 0;
  in_RDI[5] = 0;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    in_RDI[(long)local_1c + 0x19] = 0;
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    in_RDI[(long)local_1c + 0x1d] = 0;
    in_RDI[(long)local_1c + 0x21] = 0;
  }
  in_RDI[0x32] = 0;
  jinit_marker_reader(cinfo_00);
  jinit_input_controller(cinfo_00);
  *(undefined4 *)((long)in_RDI + 0x24) = 200;
  lVar1 = (**(code **)in_RDI[1])(in_RDI,0,0x90);
  in_RDI[0x44] = lVar1;
  memset((void *)in_RDI[0x44],0,0x90);
  return;
}

Assistant:

GLOBAL(void)
jpeg_CreateDecompress(j_decompress_ptr cinfo, int version, size_t structsize)
{
  int i;

  /* Guard against version mismatches between library and caller. */
  cinfo->mem = NULL;            /* so jpeg_destroy knows mem mgr not called */
  if (version != JPEG_LIB_VERSION)
    ERREXIT2(cinfo, JERR_BAD_LIB_VERSION, JPEG_LIB_VERSION, version);
  if (structsize != sizeof(struct jpeg_decompress_struct))
    ERREXIT2(cinfo, JERR_BAD_STRUCT_SIZE,
             (int)sizeof(struct jpeg_decompress_struct), (int)structsize);

  /* For debugging purposes, we zero the whole master structure.
   * But the application has already set the err pointer, and may have set
   * client_data, so we have to save and restore those fields.
   * Note: if application hasn't set client_data, tools like Purify may
   * complain here.
   */
  {
    struct jpeg_error_mgr *err = cinfo->err;
    void *client_data = cinfo->client_data; /* ignore Purify complaint here */
    MEMZERO(cinfo, sizeof(struct jpeg_decompress_struct));
    cinfo->err = err;
    cinfo->client_data = client_data;
  }
  cinfo->is_decompressor = TRUE;

  /* Initialize a memory manager instance for this object */
  jinit_memory_mgr((j_common_ptr)cinfo);

  /* Zero out pointers to permanent structures. */
  cinfo->progress = NULL;
  cinfo->src = NULL;

  for (i = 0; i < NUM_QUANT_TBLS; i++)
    cinfo->quant_tbl_ptrs[i] = NULL;

  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    cinfo->dc_huff_tbl_ptrs[i] = NULL;
    cinfo->ac_huff_tbl_ptrs[i] = NULL;
  }

  /* Initialize marker processor so application can override methods
   * for COM, APPn markers before calling jpeg_read_header.
   */
  cinfo->marker_list = NULL;
  jinit_marker_reader(cinfo);

  /* And initialize the overall input controller. */
  jinit_input_controller(cinfo);

  /* OK, I'm ready */
  cinfo->global_state = DSTATE_START;

  /* The master struct is used to store extension parameters, so we allocate it
   * here.
   */
  cinfo->master = (struct jpeg_decomp_master *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                sizeof(my_decomp_master));
  MEMZERO(cinfo->master, sizeof(my_decomp_master));
}